

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int DisconnectIM483Ix(IM483I *pIM483I)

{
  int iVar1;
  int local_1c;
  int res;
  int id;
  IM483I *pIM483I_local;
  
  local_1c = 0;
  do {
    if ((IM483I *)addrsIM483I[local_1c] == pIM483I) {
      iVar1 = DisconnectIM483I(pIM483I);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsIM483I[local_1c] = (void *)0x0;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectIM483Ix(IM483I* pIM483I)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsIM483I[id] != pIM483I)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectIM483I(pIM483I);
	if (res != EXIT_SUCCESS) return res;

	addrsIM483I[id] = NULL;

	return EXIT_SUCCESS;
}